

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O3

vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> * __thiscall
Pda::findEclosure(vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *__return_storage_ptr__,
                 Pda *this,Node *n)

{
  pointer *pppNVar1;
  char cVar2;
  pointer ppTVar3;
  iterator __position;
  char cVar4;
  bool bVar5;
  bool bVar6;
  undefined8 extraout_RAX;
  undefined8 uVar7;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar8;
  Pda *pPVar9;
  Node *n_00;
  string *newTop;
  _Elt_pointer pcVar10;
  char *pcVar11;
  pointer ppNVar12;
  pointer ppTVar13;
  Node *next;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> newclosure;
  Pda *local_110;
  void *local_108;
  iterator iStack_100;
  Node **local_f8;
  uint local_e4;
  Node *local_e0;
  pointer local_d8;
  _Deque_base<char,_std::allocator<char>_> local_d0;
  _Deque_base<char,_std::allocator<char>_> local_80;
  
  (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = n;
  std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::_M_realloc_insert<Tjen::Node*const&>
            ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)__return_storage_ptr__,(iterator)0x0
             ,&local_e0);
  uVar7 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  do {
    local_e4 = (uint)uVar7;
    local_108 = (void *)0x0;
    iStack_100._M_current = (Node **)0x0;
    local_f8 = (Node **)0x0;
    ppNVar12 = (__return_storage_ptr__->
               super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_d8 = (__return_storage_ptr__->
               super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppNVar12 == local_d8) {
      bVar6 = false;
    }
    else {
      bVar6 = false;
      do {
        pvVar8 = Tjen::Node::getTransitions(*ppNVar12);
        ppTVar3 = (pvVar8->
                  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (ppTVar13 = (pvVar8->
                        super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppTVar13 != ppTVar3;
            ppTVar13 = ppTVar13 + 1) {
          cVar4 = Tjen::Node::Transition::getInput(*ppTVar13);
          pPVar9 = (Pda *)operator_new(0x88);
          n_00 = Tjen::Node::Transition::getTo(*ppTVar13);
          Tjen::Node::Node((Node *)pPVar9,n_00);
          local_110 = pPVar9;
          Tjen::Node::getStack
                    ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_80,*ppNVar12);
          Tjen::Node::setStack
                    ((Node *)pPVar9,
                     (stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_80);
          std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_80);
          pPVar9 = local_110;
          if (cVar4 == -0x32) {
            newTop = Tjen::Node::Transition::getNewstack_abi_cxx11_(*ppTVar13);
            Tjen::Node::editStack((Node *)pPVar9,newTop);
            bVar5 = checkIfDouble(pPVar9,__return_storage_ptr__,(Node *)local_110);
            if (!bVar5) {
              Tjen::Node::getStack
                        ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_d0,
                         *ppNVar12);
              pcVar10 = local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_d0._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pcVar10 = local_d0._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
              }
              cVar4 = pcVar10[-1];
              pcVar11 = Tjen::Node::Transition::getOldStack(*ppTVar13);
              cVar2 = *pcVar11;
              std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_d0);
              if (cVar4 == cVar2) {
                if (iStack_100._M_current == local_f8) {
                  bVar6 = true;
                  std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::
                  _M_realloc_insert<Tjen::Node*const&>
                            ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)&local_108,
                             iStack_100,(Node **)&local_110);
                }
                else {
                  *iStack_100._M_current = (Node *)local_110;
                  iStack_100._M_current = iStack_100._M_current + 1;
                  bVar6 = true;
                }
              }
            }
          }
        }
        ppNVar12 = ppNVar12 + 1;
      } while (ppNVar12 != local_d8);
    }
    if ((local_e4 & 1) != 0) {
      pppNVar1 = &(__return_storage_ptr__->
                  super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + -1;
    }
    std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<Tjen::Node**,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>>
              ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start,local_108,iStack_100._M_current);
    if (local_108 != (void *)0x0) {
      operator_delete(local_108,(long)local_f8 - (long)local_108);
    }
    uVar7 = 0;
  } while (bVar6);
  __position._M_current =
       (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::_M_realloc_insert<Tjen::Node*const&>
              ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)__return_storage_ptr__,__position,
               &local_e0);
  }
  else {
    *__position._M_current = local_e0;
    pppNVar1 = &(__return_storage_ptr__->
                super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tjen::Node*> Pda::findEclosure(Tjen::Node *n) {

    std::vector<Tjen::Node *> eclosure; //totaal
    eclosure.push_back(n);

    bool found = true;
    bool first = true;
    while (found) {

        std::vector<Tjen::Node *> newclosure; //gevonden

        found = false;
        for (auto &node: eclosure) {
            for (auto &f: node->getTransitions()) {
                const char in = f->getInput();
                const char *e = "ε";

                Tjen::Node *next = new Tjen::Node(f->getTo());
                next->setStack(node->getStack());
                if (in == *e) {
                    next->editStack(f->getNewstack());

                    if (!checkIfDouble(eclosure, next) && node->getStack().top() == f->getOldStack()) {
                        newclosure.push_back(next);
                        found = true;
                    }

                }

            }
        }
        if (first) {
            eclosure.pop_back();
            first = false;
        }
        eclosure.insert(eclosure.begin(), newclosure.begin(), newclosure.end());
    }
    eclosure.push_back(n);
    return eclosure;
}